

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

int ptls_openssl_load_certificates(ptls_context_t *ctx,X509 *cert,stack_st_X509 *chain)

{
  int iVar1;
  ptls_iovec_t *dst;
  X509 *pXVar2;
  size_t sVar3;
  ulong uVar4;
  ptls_iovec_t *ppVar5;
  size_t sVar6;
  bool bVar7;
  
  if (chain == (stack_st_X509 *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = OPENSSL_sk_num(chain);
  }
  if ((ctx->certificates).list != (ptls_iovec_t *)0x0) {
    __assert_fail("ctx->certificates.list == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/openssl.c"
                  ,0x4a0,
                  "int ptls_openssl_load_certificates(ptls_context_t *, X509 *, struct stack_st_X509 *)"
                 );
  }
  sVar3 = (size_t)(int)(iVar1 + (uint)(cert != (X509 *)0x0));
  dst = (ptls_iovec_t *)malloc(sVar3 << 4);
  if (dst == (ptls_iovec_t *)0x0) {
    iVar1 = 0x201;
    sVar6 = 0;
  }
  else {
    if (cert == (X509 *)0x0) {
      sVar6 = 0;
    }
    else {
      iVar1 = serialize_cert(cert,dst);
      sVar6 = 1;
      if (iVar1 != 0) goto LAB_00109997;
    }
    if (chain != (stack_st_X509 *)0x0) {
      iVar1 = OPENSSL_sk_num(chain);
      bVar7 = iVar1 == 0;
      if (bVar7) {
        iVar1 = 0;
      }
      else {
        pXVar2 = (X509 *)OPENSSL_sk_value(chain,0);
        iVar1 = serialize_cert(pXVar2,(ptls_iovec_t *)
                                      ((long)&dst->base + (ulong)(uint)((int)sVar6 << 4)));
        if (iVar1 == 0) {
          ppVar5 = (ptls_iovec_t *)((long)&dst->base + (ulong)(uint)((int)sVar6 << 4));
          uVar4 = 1;
          do {
            ppVar5 = ppVar5 + 1;
            iVar1 = OPENSSL_sk_num(chain);
            bVar7 = (int)uVar4 == iVar1;
            if (bVar7) {
              iVar1 = 0;
              break;
            }
            pXVar2 = (X509 *)OPENSSL_sk_value(chain,uVar4 & 0xffffffff);
            iVar1 = serialize_cert(pXVar2,ppVar5);
            uVar4 = uVar4 + 1;
          } while (iVar1 == 0);
          sVar6 = sVar6 + uVar4;
        }
        else {
          sVar6 = sVar6 + 1;
        }
      }
      if (!bVar7) goto LAB_00109997;
    }
    if (sVar6 != sVar3) {
      __assert_fail("slot == count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/openssl.c"
                    ,0x4b2,
                    "int ptls_openssl_load_certificates(ptls_context_t *, X509 *, struct stack_st_X509 *)"
                   );
    }
    (ctx->certificates).list = dst;
    (ctx->certificates).count = sVar3;
    iVar1 = 0;
  }
LAB_00109997:
  if ((dst != (ptls_iovec_t *)0x0) && (ppVar5 = dst, iVar1 != 0)) {
    for (; sVar6 != 0; sVar6 = sVar6 - 1) {
      free(ppVar5->base);
      ppVar5 = ppVar5 + 1;
    }
    free(dst);
  }
  return iVar1;
}

Assistant:

int ptls_openssl_load_certificates(ptls_context_t *ctx, X509 *cert, STACK_OF(X509) * chain)
{
    ptls_iovec_t *list = NULL;
    size_t slot = 0, count = (cert != NULL) + (chain != NULL ? sk_X509_num(chain) : 0);
    int ret;

    assert(ctx->certificates.list == NULL);

    if ((list = malloc(sizeof(*list) * count)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if (cert != NULL) {
        if ((ret = serialize_cert(cert, list + slot++)) != 0)
            goto Exit;
    }
    if (chain != NULL) {
        int i;
        for (i = 0; i != sk_X509_num(chain); ++i) {
            if ((ret = serialize_cert(sk_X509_value(chain, i), list + slot++)) != 0)
                goto Exit;
        }
    }

    assert(slot == count);

    ctx->certificates.list = list;
    ctx->certificates.count = count;
    ret = 0;

Exit:
    if (ret != 0 && list != NULL) {
        size_t i;
        for (i = 0; i != slot; ++i)
            free(list[i].base);
        free(list);
    }
    return ret;
}